

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRHS.cpp
# Opt level: O3

void __thiscall HDualRHS::create_infeasList(HDualRHS *this,double columnDensity)

{
  int iVar1;
  pointer pdVar2;
  pointer pcVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer piVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  size_t __n;
  int iVar10;
  long lVar11;
  int iVar12;
  int iRow;
  size_t sVar13;
  int *piVar14;
  int iRow_1;
  double dVar15;
  double dVar16;
  double dVar17;
  
  pdVar2 = (this->workEdWtFull).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = this->workModel->numRow;
  __n = (size_t)iVar1;
  if ((long)__n < 1) {
    this->workCount = 0;
    this->workCutoff = 0.0;
    iVar8 = 0;
  }
  else {
    sVar13 = 0;
    memset((this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start,0,__n);
    this->workCount = 0;
    this->workCutoff = 0.0;
    do {
      dVar17 = (this->workArray).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[sVar13];
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[sVar13] = '\x01';
        iVar8 = this->workCount;
        this->workCount = iVar8 + 1;
        (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar8] = (int)sVar13;
      }
      sVar13 = sVar13 + 1;
    } while (__n != sVar13);
    iVar8 = this->workCount;
  }
  piVar14 = &this->workCount;
  dVar17 = (double)iVar8;
  if (columnDensity < 0.05) {
    dVar15 = (double)iVar1 * 0.01;
    dVar16 = 500.0;
    if (500.0 <= dVar15) {
      dVar16 = dVar15;
    }
    if (dVar16 < dVar17) {
      dVar16 = 500.0;
      if (500.0 <= dVar17 * 0.001) {
        dVar16 = dVar17 * 0.001;
      }
      iVar12 = (int)dVar16;
      if (iVar1 < 1) {
        dVar17 = 0.0;
      }
      else {
        pcVar3 = (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (this->workArray).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->workEdWt).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar13 = 0;
        iVar10 = 0;
        dVar16 = 0.0;
        do {
          dVar17 = dVar16;
          if (pcVar3[sVar13] != '\0') {
            dVar15 = pdVar4[sVar13] / pdVar5[sVar13];
            dVar17 = dVar15;
            if (dVar15 <= dVar16) {
              dVar17 = dVar16;
            }
            lVar11 = (long)iVar10;
            iVar10 = iVar10 + 1;
            pdVar2[lVar11] = -dVar15;
          }
          sVar13 = sVar13 + 1;
          dVar16 = dVar17;
        } while (__n != sVar13);
        dVar17 = dVar17 * 0.99999;
      }
      lVar11 = (long)iVar12;
      if ((iVar8 != 0) && (iVar8 != iVar12)) {
        uVar9 = (ulong)iVar8;
        lVar7 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        std::__introselect<double*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pdVar2,pdVar2 + lVar11,pdVar2 + uVar9,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
      }
      dVar16 = pdVar2[lVar11];
      dVar15 = dVar16 * -1.00001;
      if (dVar17 <= dVar15) {
        dVar15 = dVar17;
      }
      this->workCutoff = dVar15;
      if (iVar1 < 1) {
        *piVar14 = 0;
        iVar8 = 0;
      }
      else {
        sVar13 = 0;
        memset((this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,0,__n);
        this->workCount = 0;
        do {
          if ((this->workEdWt).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[sVar13] * this->workCutoff <=
              (this->workArray).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[sVar13]) {
            iVar8 = this->workCount;
            this->workCount = iVar8 + 1;
            (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar8] = (int)sVar13;
            (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[sVar13] = '\x01';
          }
          sVar13 = sVar13 + 1;
        } while (__n != sVar13);
        iVar8 = *piVar14;
      }
      dVar17 = (double)iVar8;
      if (((double)iVar12 * 1.5 < (double)iVar8) &&
         (*piVar14 = iVar12, dVar17 = (double)iVar12, iVar12 < iVar8)) {
        do {
          piVar6 = (this->workIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar12 = piVar6[lVar11];
          if ((this->workArray).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar12] <=
              (this->workEdWt).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar12] * -dVar16) {
            (this->workMark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[iVar12] = '\0';
          }
          else {
            iVar10 = *piVar14;
            *piVar14 = iVar10 + 1;
            piVar6[iVar10] = iVar12;
          }
          lVar11 = lVar11 + 1;
        } while (iVar8 != lVar11);
        dVar17 = (double)*piVar14;
      }
    }
  }
  if ((double)iVar1 * 0.2 < dVar17) {
    *piVar14 = -iVar1;
    this->workCutoff = 0.0;
  }
  return;
}

Assistant:

void HDualRHS::create_infeasList(double columnDensity) {
    int numRow = workModel->getNumRow();
    double *dwork = &workEdWtFull[0];

// 1. Build the full list
    fill_n(&workMark[0], numRow, 0);
    workCount = 0;
    workCutoff = 0;
    for (int iRow = 0; iRow < numRow; iRow++) {
        if (workArray[iRow]) {
            workMark[iRow] = 1;
            workIndex[workCount++] = iRow;
        }
    }

// 2. See if it worth to try to go sparse
//    (Many candidates, really sparse RHS)
    if (workCount > max(numRow * 0.01, 500.0) && columnDensity < 0.05) {
        int icutoff = max(workCount * 0.001, 500.0);
        double maxMerit = 0;
        for (int iRow = 0, iPut = 0; iRow < numRow; iRow++)
            if (workMark[iRow]) {
                double myMerit = workArray[iRow] / workEdWt[iRow];
                if (maxMerit < myMerit)
                    maxMerit = myMerit;
                dwork[iPut++] = -myMerit;
            }
        nth_element(dwork, dwork + icutoff, dwork + workCount);
        double cutMerit = -dwork[icutoff];
        workCutoff = min(maxMerit * 0.99999, cutMerit * 1.00001);

        // Create again
        fill_n(&workMark[0], numRow, 0);
        workCount = 0;
        for (int iRow = 0; iRow < numRow; iRow++) {
            if (workArray[iRow] >= workEdWt[iRow] * workCutoff) {
                workIndex[workCount++] = iRow;
                workMark[iRow] = 1;
            }
        }

        // Reduce by drop smaller
        if (workCount > icutoff * 1.5) {
            // Firstly take up "icutoff" number of elements
            int fullCount = workCount;
            workCount = icutoff;
            for (int i = icutoff; i < fullCount; i++) {
                int iRow = workIndex[i];
                if (workArray[iRow] > workEdWt[iRow] * cutMerit) {
                    workIndex[workCount++] = iRow;
                } else {
                    workMark[iRow] = 0;
                }
            }
        }

//        cout
//                << "======================================================> WORK COUNT = "
//                << workCount << "\t icutoff = " << icutoff << "\t maxMerit = "
//                << maxMerit << "\t cutMerit = " << cutMerit << endl;
    }

// 3. If there is still too much candidates: disable them
    if (workCount > 0.2 * numRow) {
        workCount = -numRow;
        workCutoff = 0;
    }
}